

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.hpp
# Opt level: O3

scalar_function_t *
duckdb::ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>
          (scalar_function_t *__return_storage_ptr__,LogicalType *type)

{
  LogicalType LVar1;
  InternalException *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  LVar1 = *type;
  switch(LVar1) {
  case (LogicalType)0xb:
    local_48[0] = UnaryFunction<signed_char,signed_char,duckdb::AbsOperator>;
    break;
  case (LogicalType)0xc:
    local_48[0] = UnaryFunction<short,short,duckdb::AbsOperator>;
    break;
  case (LogicalType)0xd:
    local_48[0] = UnaryFunction<int,int,duckdb::AbsOperator>;
    break;
  case (LogicalType)0xe:
    local_48[0] = UnaryFunction<long,long,duckdb::AbsOperator>;
    break;
  case (LogicalType)0xf:
  case (LogicalType)0x10:
  case (LogicalType)0x11:
  case (LogicalType)0x12:
  case (LogicalType)0x13:
  case (LogicalType)0x14:
  case (LogicalType)0x15:
  case (LogicalType)0x18:
  case (LogicalType)0x19:
  case (LogicalType)0x1a:
  case (LogicalType)0x1b:
switchD_006c4624_caseD_f:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_48[0] = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Unimplemented type for GetScalarUnaryFunction","");
    duckdb::InternalException::InternalException(this,(string *)local_48);
    __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case (LogicalType)0x16:
    local_48[0] = UnaryFunction<float,float,duckdb::AbsOperator>;
    break;
  case (LogicalType)0x17:
    local_48[0] = UnaryFunction<double,double,duckdb::AbsOperator>;
    break;
  case (LogicalType)0x1c:
    local_48[0] = UnaryFunction<unsigned_char,unsigned_char,duckdb::AbsOperator>;
    break;
  case (LogicalType)0x1d:
    local_48[0] = UnaryFunction<unsigned_short,unsigned_short,duckdb::AbsOperator>;
    break;
  case (LogicalType)0x1e:
    local_48[0] = UnaryFunction<unsigned_int,unsigned_int,duckdb::AbsOperator>;
    break;
  case (LogicalType)0x1f:
    local_48[0] = UnaryFunction<unsigned_long,unsigned_long,duckdb::AbsOperator>;
    break;
  default:
    if (LVar1 == (LogicalType)0x31) {
      local_48[0] = UnaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::AbsOperator>;
    }
    else {
      if (LVar1 != (LogicalType)0x32) goto switchD_006c4624_caseD_f;
      local_48[0] = UnaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::AbsOperator>;
    }
  }
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             __return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

static scalar_function_t GetScalarUnaryFunction(const LogicalType &type) {
		scalar_function_t function;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
			function = &ScalarFunction::UnaryFunction<int8_t, int8_t, OP>;
			break;
		case LogicalTypeId::SMALLINT:
			function = &ScalarFunction::UnaryFunction<int16_t, int16_t, OP>;
			break;
		case LogicalTypeId::INTEGER:
			function = &ScalarFunction::UnaryFunction<int32_t, int32_t, OP>;
			break;
		case LogicalTypeId::BIGINT:
			function = &ScalarFunction::UnaryFunction<int64_t, int64_t, OP>;
			break;
		case LogicalTypeId::UTINYINT:
			function = &ScalarFunction::UnaryFunction<uint8_t, uint8_t, OP>;
			break;
		case LogicalTypeId::USMALLINT:
			function = &ScalarFunction::UnaryFunction<uint16_t, uint16_t, OP>;
			break;
		case LogicalTypeId::UINTEGER:
			function = &ScalarFunction::UnaryFunction<uint32_t, uint32_t, OP>;
			break;
		case LogicalTypeId::UBIGINT:
			function = &ScalarFunction::UnaryFunction<uint64_t, uint64_t, OP>;
			break;
		case LogicalTypeId::HUGEINT:
			function = &ScalarFunction::UnaryFunction<hugeint_t, hugeint_t, OP>;
			break;
		case LogicalTypeId::UHUGEINT:
			function = &ScalarFunction::UnaryFunction<uhugeint_t, uhugeint_t, OP>;
			break;
		case LogicalTypeId::FLOAT:
			function = &ScalarFunction::UnaryFunction<float, float, OP>;
			break;
		case LogicalTypeId::DOUBLE:
			function = &ScalarFunction::UnaryFunction<double, double, OP>;
			break;
		default:
			throw InternalException("Unimplemented type for GetScalarUnaryFunction");
		}
		return function;
	}